

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O2

TIntermAggregate * __thiscall
glslang::TIntermediate::mergeAggregate(TIntermediate *this,TIntermNode *left,TIntermNode *right)

{
  const_iterator __position;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  __first;
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  TIntermAggregate *this_00;
  undefined4 extraout_var_00;
  long *plVar3;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long lVar4;
  TIntermNode *s;
  TIntermNode *local_38;
  TIntermNode *local_30;
  undefined4 extraout_var_01;
  
  if (left == (TIntermNode *)0x0 && right == (TIntermNode *)0x0) {
    return (TIntermAggregate *)0x0;
  }
  s = left;
  local_38 = right;
  local_30 = left;
  if (left != (TIntermNode *)0x0) {
    iVar1 = (*left->_vptr_TIntermNode[6])(left);
    this_00 = (TIntermAggregate *)CONCAT44(extraout_var,iVar1);
    if ((this_00 != (TIntermAggregate *)0x0) && ((this_00->super_TIntermOperator).op == EOpNull))
    goto LAB_00404817;
  }
  this_00 = (TIntermAggregate *)TIntermNode::operator_new((TIntermNode *)0x188,(size_t)s);
  TIntermAggregate::TIntermAggregate(this_00);
  if (left != (TIntermNode *)0x0) {
    iVar1 = (*(this_00->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x32])(this_00);
    std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::push_back
              ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
               CONCAT44(extraout_var_00,iVar1),&local_30);
  }
LAB_00404817:
  iVar1 = (*right->_vptr_TIntermNode[6])(right);
  plVar3 = (long *)CONCAT44(extraout_var_01,iVar1);
  if ((plVar3 == (long *)0x0) || ((int)plVar3[0x17] != 0)) {
    iVar1 = (*(this_00->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x32])(this_00);
    std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::push_back
              ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
               CONCAT44(extraout_var_02,iVar1),&local_38);
  }
  else {
    iVar1 = (*(this_00->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x32])(this_00);
    iVar2 = (*(this_00->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x32])(this_00);
    __position._M_current = *(TIntermNode ***)(CONCAT44(extraout_var_04,iVar2) + 0x10);
    lVar4 = (**(code **)(*plVar3 + 400))(plVar3);
    __first._M_current = *(TIntermNode ***)(lVar4 + 8);
    lVar4 = (**(code **)(*plVar3 + 400))(plVar3);
    std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::
    insert<__gnu_cxx::__normal_iterator<TIntermNode**,std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>>,void>
              ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)
               CONCAT44(extraout_var_03,iVar1),__position,__first,
               (__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                )*(TIntermNode ***)(lVar4 + 0x10));
  }
  return this_00;
}

Assistant:

TIntermAggregate* TIntermediate::mergeAggregate(TIntermNode* left, TIntermNode* right)
{
    if (left == nullptr && right == nullptr)
        return nullptr;

    TIntermAggregate* aggNode = nullptr;
    if (left != nullptr)
        aggNode = left->getAsAggregate();
    if (aggNode == nullptr || aggNode->getOp() != EOpNull) {
        aggNode = new TIntermAggregate;
        if (left != nullptr)
            aggNode->getSequence().push_back(left);
    }

    TIntermAggregate* rhsagg = right->getAsAggregate();
    if (rhsagg == nullptr || rhsagg->getOp() != EOpNull)
        aggNode->getSequence().push_back(right);
    else
        aggNode->getSequence().insert(aggNode->getSequence().end(),
                                      rhsagg->getSequence().begin(),
                                      rhsagg->getSequence().end());

    return aggNode;
}